

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O0

void dump_frame(FILE *fp,MppFrame frame,RK_U8 *tmp,RK_U32 w,RK_U32 h)

{
  RK_U8 RVar1;
  MppFrameFormat MVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  MppBuffer buffer;
  RK_U8 *tmp_line_00;
  RK_S64 RVar5;
  uint local_90;
  RK_U8 *tmp_line;
  RK_U8 *base_c;
  RK_U8 *base_y;
  RK_U32 img_h;
  RK_U32 img_w;
  RK_U32 step;
  RK_U32 size;
  RK_U8 *pdes;
  RK_U8 *psrc;
  RK_U8 *p_buf;
  RK_U32 ver_stride;
  RK_U32 hor_stride;
  RK_U32 height;
  RK_U32 width;
  RK_U32 fmt;
  RK_U32 j;
  RK_U32 i;
  RK_U32 h_local;
  RK_U32 w_local;
  RK_U8 *tmp_local;
  MppFrame frame_local;
  FILE *fp_local;
  
  MVar2 = mpp_frame_get_fmt(frame);
  MVar2 = MVar2 & 0xfffff;
  hor_stride = mpp_frame_get_width(frame);
  ver_stride = mpp_frame_get_height(frame);
  RVar3 = mpp_frame_get_hor_stride(frame);
  RVar4 = mpp_frame_get_ver_stride(frame);
  buffer = mpp_frame_get_buffer(frame);
  _h_local = (RK_U8 *)mpp_buffer_get_ptr_with_caller(buffer,"dump_frame");
  img_w = 0;
  if (tmp == (RK_U8 *)0x0) {
    switch(MVar2) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420P:
      img_w = RVar3 * RVar4 * 3 >> 1;
      break;
    case MPP_FMT_YUV420SP_10BIT:
      tmp_line = _h_local + RVar3 * RVar4;
      tmp_line_00 = (RK_U8 *)mpp_osal_malloc("dump_frame",(ulong)hor_stride << 1);
      if (tmp_line_00 == (RK_U8 *)0x0) {
        _mpp_log_l(4,"mpp_impl","tmp_line malloc fail",(char *)0x0);
        return;
      }
      base_c = _h_local;
      for (fmt = 0; fmt < ver_stride; fmt = fmt + 1) {
        for (width = 0; width < hor_stride + 7 >> 3; width = width + 1) {
          rearrange_pix(tmp_line_00,base_c,width);
        }
        fwrite(tmp_line_00,(ulong)hor_stride << 1,1,(FILE *)fp);
        base_c = base_c + RVar3;
      }
      for (fmt = 0; fmt < ver_stride >> 1; fmt = fmt + 1) {
        for (width = 0; width < hor_stride + 7 >> 3; width = width + 1) {
          rearrange_pix(tmp_line_00,tmp_line,width);
        }
        fwrite(tmp_line_00,(ulong)hor_stride << 1,1,(FILE *)fp);
        tmp_line = tmp_line + RVar3;
      }
      if (tmp_line_00 != (RK_U8 *)0x0) {
        mpp_osal_free("dump_frame",tmp_line_00);
      }
    default:
      break;
    case MPP_FMT_YUV422SP:
      img_w = RVar3 * RVar4 * 2;
      break;
    case MPP_FMT_YUV444SP:
      img_w = RVar3 * RVar4 * 3;
    }
  }
  else {
    _step = tmp;
    pdes = _h_local;
    if ((w < RVar3) || (h < RVar4)) {
      if (((RVar4 + h) - 1) / h < ((RVar3 + w) - 1) / w) {
        local_90 = ((RVar3 + w) - 1) / w;
      }
      else {
        local_90 = ((RVar4 + h) - 1) / h;
      }
      hor_stride = hor_stride / local_90 - (hor_stride / local_90 & 1);
      ver_stride = ver_stride / local_90 - (ver_stride / local_90 & 1);
      for (fmt = 0; fmt < ver_stride; fmt = fmt + 1) {
        for (width = 0; width < hor_stride; width = width + 1) {
          RVar1 = fetch_data(MVar2,pdes,width * local_90);
          _step[width] = RVar1;
        }
        _step = _step + hor_stride;
        pdes = pdes + local_90 * RVar3;
      }
      pdes = _h_local + RVar3 * RVar4;
      _step = tmp + hor_stride * ver_stride;
      for (fmt = 0; fmt < ver_stride >> 1; fmt = fmt + 1) {
        for (width = 0; width < hor_stride >> 1; width = width + 1) {
          RVar1 = fetch_data(MVar2,pdes,width * 2 * local_90);
          _step[width << 1] = RVar1;
          RVar1 = fetch_data(MVar2,pdes,width * 2 * local_90 + 1);
          _step[width * 2 + 1] = RVar1;
        }
        _step = _step + hor_stride;
        pdes = pdes + local_90 * RVar3;
      }
    }
    else if (MVar2 == MPP_FMT_YUV420SP_10BIT) {
      for (fmt = 0; fmt < ver_stride; fmt = fmt + 1) {
        for (width = 0; width < hor_stride; width = width + 1) {
          RVar1 = fetch_data(1,pdes,width);
          _step[width] = RVar1;
        }
        _step = _step + hor_stride;
        pdes = pdes + RVar3;
      }
      pdes = _h_local + RVar3 * RVar4;
      _step = tmp + hor_stride * ver_stride;
      for (fmt = 0; fmt < ver_stride >> 1; fmt = fmt + 1) {
        for (width = 0; width < hor_stride; width = width + 1) {
          RVar1 = fetch_data(1,pdes,width);
          _step[width] = RVar1;
        }
        _step = _step + hor_stride;
        pdes = pdes + RVar3;
      }
    }
    img_w = (RK_U32)(long)((double)(hor_stride * ver_stride) * 1.5);
    _h_local = tmp;
  }
  RVar5 = mpp_frame_get_pts(frame);
  _mpp_log_l(4,"mpp_impl","dump_yuv: w:h [%d:%d] stride [%d:%d] pts %lld\n",(char *)0x0,
             (ulong)hor_stride,(ulong)ver_stride,RVar3,RVar4,RVar5);
  if (img_w != 0) {
    fwrite(_h_local,1,(ulong)img_w,(FILE *)fp);
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

static void dump_frame(FILE *fp, MppFrame frame, RK_U8 *tmp, RK_U32 w, RK_U32 h)
{
    RK_U32 i = 0, j = 0;
    RK_U32 fmt = (mpp_frame_get_fmt(frame) & MPP_FRAME_FMT_MASK);
    RK_U32 width = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
    RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
    RK_U8 *p_buf = (RK_U8 *) mpp_buffer_get_ptr(mpp_frame_get_buffer(frame));

    RK_U8 *psrc = p_buf;
    RK_U8 *pdes = tmp;
    RK_U32 size = 0;

    if (pdes) {
        if (hor_stride > w || ver_stride > h) {
            RK_U32 step = MPP_MAX((hor_stride + w - 1) / w,
                                  (ver_stride + h - 1) / h);
            RK_U32 img_w = width / step;
            RK_U32 img_h = height / step;

            img_w -= img_w & 0x1;
            img_h -= img_h & 0x1;
            for (i = 0; i < img_h; i++) {
                for (j = 0; j < img_w; j++)
                    pdes[j] = fetch_data(fmt, psrc, j * step);
                pdes += img_w;
                psrc += step * hor_stride;
            }
            psrc = p_buf + hor_stride * ver_stride;
            pdes = tmp + img_w * img_h;
            for (i = 0; i < (img_h / 2); i++) {
                for (j = 0; j < (img_w / 2); j++) {
                    pdes[2 * j + 0] = fetch_data(fmt, psrc, 2 * j * step + 0);
                    pdes[2 * j + 1] = fetch_data(fmt, psrc, 2 * j * step + 1);
                }
                pdes += img_w;
                psrc += step * hor_stride;
            }
            width = img_w;
            height = img_h;
        } else if (fmt == MPP_FMT_YUV420SP_10BIT) {
            for (i = 0; i < height; i++) {
                for (j = 0; j < width; j++)
                    pdes[j] = fetch_data(fmt, psrc, j);
                pdes += width;
                psrc += hor_stride;
            }
            psrc = p_buf + hor_stride * ver_stride;
            pdes = tmp + width * height;
            for (i = 0; i < height / 2; i++) {
                for (j = 0; j < width; j++)
                    pdes[j] = fetch_data(fmt, psrc, j);
                pdes += width;
                psrc += hor_stride;
            }
        }
        size = width * height * 1.5;
    } else {
        tmp = p_buf;
        switch (fmt) {
        case MPP_FMT_YUV420SP :
        case MPP_FMT_YUV420P : {
            size = hor_stride * ver_stride * 3 / 2;
        } break;
        case MPP_FMT_YUV422SP : {
            size = hor_stride * ver_stride * 2;
        } break;
        case MPP_FMT_YUV444SP : {
            size = hor_stride * ver_stride * 3;
        } break;
        case MPP_FMT_YUV420SP_10BIT : {
            RK_U8 *base_y = p_buf;
            RK_U8 *base_c = p_buf + hor_stride * ver_stride;
            RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

            if (!tmp_line) {
                mpp_log("tmp_line malloc fail");
                return;
            }

            for (i = 0; i < height; i++, base_y += hor_stride) {
                for (j = 0; j < MPP_ALIGN(width, 8) / 8; j++)
                    rearrange_pix(tmp_line, base_y, j);
                fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
            }

            for (i = 0; i < height / 2; i++, base_c += hor_stride) {
                for (j = 0; j < MPP_ALIGN(width, 8) / 8; j++)
                    rearrange_pix(tmp_line, base_c, j);
                fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
            }
            MPP_FREE(tmp_line);
        }
        default : break;
        }
    }
    mpp_log("dump_yuv: w:h [%d:%d] stride [%d:%d] pts %lld\n",
            width, height, hor_stride, ver_stride, mpp_frame_get_pts(frame));
    if (size)
        fwrite(tmp, 1, size, fp);
    fflush(fp);
}